

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::elemental_vector::increase_capacity
          (elemental_vector *this,uint32 min_new_capacity,bool grow_hint,uint32 element_size,
          object_mover pMover)

{
  undefined8 in_RAX;
  void *pvVar1;
  uint uVar2;
  size_t actual_size;
  
  actual_size = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (min_new_capacity <= this->m_capacity) goto LAB_0010e9c7;
  if ((grow_hint) &&
     (uVar2 = min_new_capacity - (min_new_capacity >> 1 & 0x55555555),
     uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
     1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    min_new_capacity = math::next_pow2(min_new_capacity);
  }
  uVar2 = min_new_capacity * element_size;
  if (pMover == (object_mover)0x0) {
    pvVar1 = crnd_realloc(this->m_p,(ulong)uVar2,&actual_size,true);
    if (pvVar1 != (void *)0x0) goto LAB_0010e999;
  }
  else {
    pvVar1 = crnd_malloc((ulong)uVar2,&actual_size);
    if (pvVar1 != (void *)0x0) {
      (*pMover)(pvVar1,this->m_p,this->m_size);
      if (this->m_p != (void *)0x0) {
        crnd_free(this->m_p);
      }
LAB_0010e999:
      this->m_p = pvVar1;
      if (uVar2 < actual_size) {
        min_new_capacity = (uint32)(actual_size / element_size);
      }
      this->m_capacity = min_new_capacity;
      actual_size = 1;
      goto LAB_0010e9c7;
    }
  }
  actual_size = 0;
LAB_0010e9c7:
  return SUB81(actual_size,0);
}

Assistant:

bool elemental_vector::increase_capacity(uint32 min_new_capacity, bool grow_hint, uint32 element_size, object_mover pMover)
    {
        CRND_ASSERT(m_size <= m_capacity);
        CRND_ASSERT(min_new_capacity < (0x7FFF0000U / element_size));

        if (m_capacity >= min_new_capacity)
            return true;

        uint32 new_capacity = min_new_capacity;
        if ((grow_hint) && (!math::is_power_of_2(new_capacity)))
            new_capacity = math::next_pow2(new_capacity);

        CRND_ASSERT(new_capacity && (new_capacity > m_capacity));

        const uint32 desired_size = element_size * new_capacity;
        size_t actual_size;
        if (!pMover)
        {
            void* new_p = crnd_realloc(m_p, desired_size, &actual_size, true);
            if (!new_p)
                return false;
            m_p = new_p;
        }
        else
        {
            void* new_p = crnd_malloc(desired_size, &actual_size);
            if (!new_p)
                return false;

            (*pMover)(new_p, m_p, m_size);

            if (m_p)
                crnd_free(m_p);

            m_p = new_p;
        }

        if (actual_size > desired_size)
            m_capacity = static_cast<uint32>(actual_size / element_size);
        else
            m_capacity = new_capacity;

        return true;
    }